

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueNonUnique(AnnotatorImpl *this,string *id)

{
  IssueImpl *this_00;
  element_type *peVar1;
  size_type __val;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  IssuePtr issue;
  string *id_local;
  AnnotatorImpl *this_local;
  
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)id;
  Issue::IssueImpl::create();
  peVar1 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  this_00 = peVar1->mPimpl;
  std::operator+(&local_a8,"The identifier \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
  std::operator+(&local_88,&local_a8,"\' occurs ");
  __val = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
          ::count(&this->mIdList,
                  (key_type *)
                  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi);
  std::__cxx11::to_string(&local_d8,__val);
  std::operator+(&local_68,&local_88,&local_d8);
  std::operator+(&local_48,&local_68," times in the model so a unique item cannot be located.");
  Issue::IssueImpl::setDescription(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  peVar1 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  Issue::IssueImpl::setLevel(peVar1->mPimpl,WARNING);
  peVar1 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  Issue::IssueImpl::setReferenceRule(peVar1->mPimpl,ANNOTATOR_ID_NOT_UNIQUE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_28);
  std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_28);
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueNonUnique(const std::string &id)
{
    auto issue = Issue::IssueImpl::create();
    issue->mPimpl->setDescription("The identifier '" + id + "' occurs " + std::to_string(mIdList.count(id)) + " times in the model so a unique item cannot be located.");
    issue->mPimpl->setLevel(Issue::Level::WARNING);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_ID_NOT_UNIQUE);
    addIssue(issue);
}